

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_get_memory_space(adios2_memory_space *mem,adios2_variable *variable)

{
  *mem = (uint)(*(int *)(variable + 0x3c) == 1);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get_memory_space(adios2_memory_space *mem, adios2_variable *variable)
{
    try
    {
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        *mem = adios2_FromMemorySpace(variableBase->m_MemSpace);

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_memory_space"));
    }
}